

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

void __thiscall
TEST_MockParameterTest_longAndUnsignedLongWithSameBitRepresentationShouldNotBeTreatedAsEqual_Test::
testBody(TEST_MockParameterTest_longAndUnsignedLongWithSameBitRepresentationShouldNotBeTreatedAsEqual_Test
         *this)

{
  int iVar1;
  MockCheckedExpectedCall *pMVar2;
  UtestShell *test;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MockFailureReporterInstaller failureReporterInstaller;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  MockExpectedCallsListForTest expectations;
  MockUnexpectedInputParameterFailure expectedFailure;
  MockNamedValue parameter;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&failureReporterInstaller);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest(&expectations);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"foo");
  pMVar2 = MockExpectedCallsListForTest::addFunction(&expectations,(SimpleString *)&expectedFailure)
  ;
  SimpleString::SimpleString((SimpleString *)&parameter,"parameter");
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0xd])
            (pMVar2,&parameter,0xffffffffffffffff);
  SimpleString::~SimpleString((SimpleString *)&parameter);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  SimpleString::SimpleString((SimpleString *)&expectedFailure,"parameter");
  MockNamedValue::MockNamedValue(&parameter,(SimpleString *)&expectedFailure);
  SimpleString::~SimpleString((SimpleString *)&expectedFailure);
  MockNamedValue::setValue(&parameter,0xffffffffffffffff);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_100,"foo");
  MockUnexpectedInputParameterFailure::MockUnexpectedInputParameterFailure
            (&expectedFailure,test,&local_100,&parameter,&expectations.super_MockExpectedCallsList);
  SimpleString::~SimpleString(&local_100);
  SimpleString::SimpleString(&local_100,"");
  pMVar3 = mock(&local_100,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_e0,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_e0);
  SimpleString::SimpleString(&local_f0,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x68))
            ((long *)CONCAT44(extraout_var,iVar1),&local_f0,0xffffffffffffffff);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_100);
  SimpleString::SimpleString(&local_100,"");
  pMVar3 = mock(&local_100,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_e0,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_e0);
  SimpleString::SimpleString(&local_f0,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x58))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_f0,0xffffffffffffffff);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_100);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            (&expectedFailure.super_MockFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x10f);
  TestFailure::~TestFailure((TestFailure *)&expectedFailure);
  MockNamedValue::~MockNamedValue(&parameter);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest(&expectations);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&failureReporterInstaller);
  return;
}

Assistant:

TEST(MockParameterTest, longAndUnsignedLongWithSameBitRepresentationShouldNotBeTreatedAsEqual)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("parameter", (long)-1);
    MockNamedValue parameter("parameter");
    parameter.setValue((unsigned long)-1);
    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withParameter("parameter", (long)-1);
    mock().actualCall("foo").withParameter("parameter", (unsigned long)-1);

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}